

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFanio.c
# Opt level: O1

void Abc_ObjDeleteFanin(Abc_Obj_t *pObj,Abc_Obj_t *pFanin)

{
  uint uVar1;
  int *piVar2;
  long lVar3;
  int *piVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  int *piVar8;
  char *__format;
  uint uVar9;
  ulong uVar10;
  int *piVar11;
  int *piVar12;
  bool bVar13;
  
  if (((ulong)pObj & 1) != 0) {
    __assert_fail("!Abc_ObjIsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcFanio.c"
                  ,0x71,"void Abc_ObjDeleteFanin(Abc_Obj_t *, Abc_Obj_t *)");
  }
  if (((ulong)pFanin & 1) != 0) {
    __assert_fail("!Abc_ObjIsComplement(pFanin)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcFanio.c"
                  ,0x72,"void Abc_ObjDeleteFanin(Abc_Obj_t *, Abc_Obj_t *)");
  }
  if (pObj->pNtk != pFanin->pNtk) {
    __assert_fail("pObj->pNtk == pFanin->pNtk",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcFanio.c"
                  ,0x73,"void Abc_ObjDeleteFanin(Abc_Obj_t *, Abc_Obj_t *)");
  }
  if ((pObj->Id < 0) || (iVar6 = pFanin->Id, iVar6 < 0)) {
    __assert_fail("pObj->Id >= 0 && pFanin->Id >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcFanio.c"
                  ,0x74,"void Abc_ObjDeleteFanin(Abc_Obj_t *, Abc_Obj_t *)");
  }
  uVar1 = (pObj->vFanins).nSize;
  uVar7 = 0;
  bVar13 = 0 < (int)uVar1;
  if (0 < (int)uVar1) {
    piVar11 = (pObj->vFanins).pArray;
    bVar13 = true;
    if (*piVar11 != iVar6) {
      uVar10 = 0;
      do {
        if ((ulong)uVar1 - 1 == uVar10) {
          bVar13 = false;
          uVar7 = (ulong)uVar1;
          goto LAB_00840aed;
        }
        uVar7 = uVar10 + 1;
        lVar3 = uVar10 + 1;
        uVar10 = uVar7;
      } while (piVar11[lVar3] != iVar6);
      bVar13 = uVar7 < uVar1;
    }
  }
LAB_00840aed:
  piVar11 = &pObj->Id;
  piVar8 = &pFanin->Id;
  __format = "The obj %d is not found among the fanins of obj %d ...\n";
  uVar9 = (uint)uVar7;
  piVar4 = piVar11;
  if (uVar9 != uVar1) {
    if (!bVar13) {
LAB_00840c9c:
      __assert_fail("i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,999,"int Vec_IntRemove(Vec_Int_t *, int)");
    }
    uVar5 = uVar1;
    if ((int)(uVar9 + 1) < (int)uVar1) {
      piVar2 = (pObj->vFanins).pArray;
      piVar12 = piVar2 + (uVar9 + 1);
      uVar7 = uVar7 & 0xffffffff;
      do {
        iVar6 = (int)uVar7;
        piVar2[uVar7] = *piVar12;
        uVar5 = (pObj->vFanins).nSize;
        piVar12 = piVar12 + 1;
        uVar7 = (ulong)(iVar6 + 1);
      } while (iVar6 + 2 < (int)uVar5);
    }
    (pObj->vFanins).nSize = uVar5 - 1;
    if (uVar9 != uVar1) {
      uVar1 = (pFanin->vFanouts).nSize;
      uVar7 = 0;
      bVar13 = 0 < (int)uVar1;
      if (0 < (int)uVar1) {
        piVar4 = (pFanin->vFanouts).pArray;
        bVar13 = true;
        if (*piVar4 != *piVar11) {
          uVar10 = 0;
          do {
            if ((ulong)uVar1 - 1 == uVar10) {
              bVar13 = false;
              uVar7 = (ulong)uVar1;
              goto LAB_00840baf;
            }
            uVar7 = uVar10 + 1;
            lVar3 = uVar10 + 1;
            uVar10 = uVar7;
          } while (piVar4[lVar3] != *piVar11);
          bVar13 = uVar7 < uVar1;
        }
      }
LAB_00840baf:
      __format = "The obj %d is not found among the fanouts of obj %d ...\n";
      uVar9 = (uint)uVar7;
      piVar4 = piVar8;
      piVar8 = piVar11;
      if (uVar9 != uVar1) {
        if (!bVar13) goto LAB_00840c9c;
        uVar5 = uVar1;
        if ((int)(uVar9 + 1) < (int)uVar1) {
          piVar12 = (pFanin->vFanouts).pArray;
          piVar11 = piVar12 + (uVar9 + 1);
          uVar7 = uVar7 & 0xffffffff;
          do {
            iVar6 = (int)uVar7;
            piVar12[uVar7] = *piVar11;
            uVar5 = (pFanin->vFanouts).nSize;
            piVar11 = piVar11 + 1;
            uVar7 = (ulong)(iVar6 + 1);
          } while (iVar6 + 2 < (int)uVar5);
        }
        (pFanin->vFanouts).nSize = uVar5 - 1;
        if (uVar9 != uVar1) {
          return;
        }
      }
    }
  }
  printf(__format,(ulong)(uint)*piVar8,(ulong)(uint)*piVar4);
  return;
}

Assistant:

void Abc_ObjDeleteFanin( Abc_Obj_t * pObj, Abc_Obj_t * pFanin )
{
    assert( !Abc_ObjIsComplement(pObj) );
    assert( !Abc_ObjIsComplement(pFanin) );
    assert( pObj->pNtk == pFanin->pNtk );
    assert( pObj->Id >= 0 && pFanin->Id >= 0 );
    if ( !Vec_IntRemove( &pObj->vFanins, pFanin->Id ) )
    {
        printf( "The obj %d is not found among the fanins of obj %d ...\n", pFanin->Id, pObj->Id );
        return;
    }
    if ( !Vec_IntRemove( &pFanin->vFanouts, pObj->Id ) )
    {
        printf( "The obj %d is not found among the fanouts of obj %d ...\n", pObj->Id, pFanin->Id );
        return;
    }
}